

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.cpp
# Opt level: O1

void __thiscall
Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::addAtomConstraints
          (ComponentMap *this,SharedContext *comp)

{
  LitVec *this_00;
  pointer pMVar1;
  ClauseCreator *pCVar2;
  ulong uVar3;
  ClauseCreator cc2;
  ClauseCreator cc1;
  Literal local_84;
  Literal local_80;
  Literal local_7c;
  ulong local_78;
  ClauseCreator local_70;
  ClauseCreator local_50;
  
  ClauseCreator::ClauseCreator(&local_50,*(comp->solvers_).ebo_.buf);
  ClauseCreator::ClauseCreator(&local_70,*(comp->solvers_).ebo_.buf);
  local_50.flags_._1_1_ = local_50.flags_._1_1_ | 1;
  ClauseCreator::start(&local_50,Static);
  local_78 = (ulong)this->numAtoms;
  if (local_78 != 0) {
    pMVar1 = (this->mapping).ebo_.buf;
    local_78 = local_78 << 3;
    uVar3 = 0;
    do {
      local_80.rep_ = *(int *)(&pMVar1->field_0x4 + uVar3) << 2;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                (&local_50.literals_,&local_80);
      if (0x3fffffff < *(uint *)(&pMVar1->field_0x4 + uVar3)) {
        pCVar2 = ClauseCreator::start(&local_70,Static);
        local_80.rep_ = 2;
        this_00 = &pCVar2->literals_;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (this_00,&local_80);
        local_84.rep_ = *(int *)(&pMVar1->field_0x4 + uVar3) << 2;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (this_00,&local_84);
        local_7c.rep_ = *(int *)(&pMVar1->field_0x4 + uVar3) * 4 + 4;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (this_00,&local_7c);
        ClauseCreator::end(pCVar2,0x14);
        pCVar2 = ClauseCreator::start(&local_70,Static);
        local_80.rep_ = *(int *)(&pMVar1->field_0x4 + uVar3) * 4 + 6;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (&pCVar2->literals_,&local_80);
        local_84.rep_ = 0;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (&pCVar2->literals_,&local_84);
        ClauseCreator::end(pCVar2,0x14);
        pCVar2 = ClauseCreator::start(&local_70,Static);
        local_80.rep_ = *(int *)(&pMVar1->field_0x4 + uVar3) * 4 + 6;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (&pCVar2->literals_,&local_80);
        local_84.rep_ = *(int *)(&pMVar1->field_0x4 + uVar3) * 4 + 2;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (&pCVar2->literals_,&local_84);
        ClauseCreator::end(pCVar2,0x14);
      }
      uVar3 = uVar3 + 8;
    } while (local_78 != uVar3);
  }
  ClauseCreator::end(&local_50,0x14);
  if (local_70.literals_.ebo_.buf != (pointer)0x0) {
    operator_delete(local_70.literals_.ebo_.buf);
  }
  if (local_50.literals_.ebo_.buf != (pointer)0x0) {
    operator_delete(local_50.literals_.ebo_.buf);
  }
  return;
}

Assistant:

void PrgDepGraph::NonHcfComponent::ComponentMap::addAtomConstraints(SharedContext& comp) {
	ClauseCreator cc1(comp.master()), cc2(comp.master());
	cc1.addDefaultFlags(ClauseCreator::clause_force_simplify);
	cc1.start();
	for (MapRange r = atoms(); r.first != r.second; ++r.first) {
		const Mapping& m = *r.first;
		cc1.add(m.up());
		if (m.disj()) {
			cc2.start().add(~m.tp()).add(m.up()).add(m.hp()).end(); // [~tp v up v hp]
			cc2.start().add(~m.hp()).add(m.tp()).end();  // [~hp v tp]
			cc2.start().add(~m.hp()).add(~m.up()).end(); // [~hp v ~up]
		}
	}
	cc1.end();
}